

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debugger.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  string file;
  NanoDebugger debugger;
  string local_108;
  long *local_e8;
  long local_e0;
  long local_d8 [2];
  NanoDebugger local_c8;
  
  if (argc < 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Usage NanoDebugger.exe [FILE]",0x1d);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
    std::ostream::put(-0x10);
    std::ostream::flush();
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,argv[1],(allocator<char> *)&local_c8);
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_108,local_e8,local_e0 + (long)local_e8)
  ;
  NanoDebugger::NanoDebugger(&local_c8,&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  NanoDebugger::debug(&local_c8);
  NanoDebugger::~NanoDebugger(&local_c8);
  if (local_e8 != local_d8) {
    operator_delete(local_e8,local_d8[0] + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
	if (argc < 1) {
		std::cout << "Usage NanoDebugger.exe [FILE]" << std::endl;
	}
	std::string file = (argv[1]);
	NanoDebugger debugger(file);
	debugger.debug();
	return 0;
}